

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O1

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  Type TVar1;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  
  pcVar4 = (result->file_name_)._M_dataplus._M_p;
  if (pcVar4 == (char *)0x0 || (result->file_name_)._M_string_length == 0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,result->line_number_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  TVar1 = result->type_;
  if (TVar1 == kSuccess) {
    pcVar4 = "Success";
  }
  else if (TVar1 == kSkip) {
    pcVar4 = "Skipped";
  }
  else {
    pcVar4 = "Non-fatal failure";
    if (TVar1 == kFatalFailure) {
      pcVar4 = "Fatal failure";
    }
  }
  sVar3 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  pcVar4 = (result->message_)._M_dataplus._M_p;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os << result.file_name() << ":" << result.line_number() << ": "
            << (result.type() == TestPartResult::kSuccess
                    ? "Success"
                    : result.type() == TestPartResult::kSkip
                          ? "Skipped"
                          : result.type() == TestPartResult::kFatalFailure
                                ? "Fatal failure"
                                : "Non-fatal failure")
            << ":\n"
            << result.message() << std::endl;
}